

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O3

void stbir__resample_horizontal_upsample(stbir__info *stbir_info,float *output_buffer)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float *pfVar7;
  stbir__contributors *psVar8;
  float *pfVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  
  iVar2 = stbir_info->output_w;
  if (0 < (long)iVar2) {
    uVar3 = stbir_info->channels;
    lVar11 = (long)(int)uVar3;
    pfVar7 = stbir_info->decode_buffer;
    lVar16 = (long)(int)(stbir_info->horizontal_filter_pixel_margin * uVar3);
    psVar8 = stbir_info->horizontal_contributors;
    pfVar9 = stbir_info->horizontal_coefficients;
    iVar4 = stbir_info->horizontal_coefficient_width;
    lVar21 = 0;
    pfVar14 = output_buffer;
    pfVar15 = pfVar9;
    do {
      iVar5 = psVar8[lVar21].n0;
      lVar12 = (long)iVar5;
      iVar6 = psVar8[lVar21].n1;
      if (iVar6 < iVar5) {
        __assert_fail("n1 >= n0",
                      "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                      ,0x5b5,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
      }
      iVar17 = stbir_info->horizontal_filter_pixel_margin;
      if (SBORROW4(iVar5,-iVar17) != iVar5 + iVar17 < 0) {
        __assert_fail("n0 >= -stbir_info->horizontal_filter_pixel_margin",
                      "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                      ,0x5b6,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
      }
      iVar17 = iVar17 + stbir_info->input_w;
      if (iVar17 <= iVar5) {
        __assert_fail("n0 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin",
                      "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                      ,0x5b8,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
      }
      if (iVar17 <= iVar6) {
        __assert_fail("n1 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin",
                      "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                      ,0x5b9,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
      }
      if (uVar3 - 1 < 4) {
        lVar19 = lVar21 * lVar11;
        switch(uVar3) {
        case 1:
          uVar20 = 0;
          do {
            fVar1 = pfVar15[uVar20];
            if ((fVar1 == 0.0) && (!NAN(fVar1))) {
              __assert_fail("coefficient != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                            ,0x5c1,
                            "void stbir__resample_horizontal_upsample(stbir__info *, float *)");
            }
            lVar10 = lVar12 + uVar20;
            uVar20 = uVar20 + 1;
            output_buffer[lVar19] = fVar1 * pfVar7[lVar16 + lVar10] + output_buffer[lVar19];
          } while ((iVar6 - iVar5) + 1 != uVar20);
          break;
        case 2:
          uVar20 = 0;
          do {
            fVar1 = pfVar15[uVar20];
            if ((fVar1 == 0.0) && (!NAN(fVar1))) {
              __assert_fail("coefficient != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                            ,0x5ca,
                            "void stbir__resample_horizontal_upsample(stbir__info *, float *)");
            }
            output_buffer[lVar19] =
                 pfVar7[lVar16 + lVar12 * 2 + uVar20 * 2] * fVar1 + output_buffer[lVar19];
            lVar10 = uVar20 * 2;
            uVar20 = uVar20 + 1;
            output_buffer[lVar19 + 1] =
                 fVar1 * pfVar7[lVar16 + lVar12 * 2 + lVar10 + 1] + output_buffer[lVar19 + 1];
          } while ((iVar6 - iVar5) + 1 != uVar20);
          break;
        case 3:
          pfVar13 = pfVar7 + lVar16 + lVar12 * 3 + 2;
          uVar20 = 0;
          do {
            fVar1 = pfVar15[uVar20];
            if ((fVar1 == 0.0) && (!NAN(fVar1))) {
              __assert_fail("coefficient != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                            ,0x5d4,
                            "void stbir__resample_horizontal_upsample(stbir__info *, float *)");
            }
            output_buffer[lVar19] = pfVar13[-2] * fVar1 + output_buffer[lVar19];
            output_buffer[lVar19 + 1] = pfVar13[-1] * fVar1 + output_buffer[lVar19 + 1];
            uVar20 = uVar20 + 1;
            output_buffer[lVar19 + 2] = fVar1 * *pfVar13 + output_buffer[lVar19 + 2];
            pfVar13 = pfVar13 + 3;
          } while ((iVar6 - iVar5) + 1 != uVar20);
          break;
        case 4:
          pfVar13 = pfVar7 + lVar16 + lVar12 * 4 + 3;
          uVar20 = 0;
          do {
            fVar1 = pfVar15[uVar20];
            if ((fVar1 == 0.0) && (!NAN(fVar1))) {
              __assert_fail("coefficient != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                            ,0x5df,
                            "void stbir__resample_horizontal_upsample(stbir__info *, float *)");
            }
            output_buffer[lVar19] = pfVar13[-3] * fVar1 + output_buffer[lVar19];
            output_buffer[lVar19 + 1] = pfVar13[-2] * fVar1 + output_buffer[lVar19 + 1];
            output_buffer[lVar19 + 2] = pfVar13[-1] * fVar1 + output_buffer[lVar19 + 2];
            uVar20 = uVar20 + 1;
            output_buffer[lVar19 + 3] = fVar1 * *pfVar13 + output_buffer[lVar19 + 3];
            pfVar13 = pfVar13 + 4;
          } while ((iVar6 - iVar5) + 1 != uVar20);
        }
      }
      else {
        lVar12 = (long)pfVar7 + lVar12 * lVar11 * 4 + lVar16 * 4;
        uVar20 = 0;
        do {
          fVar1 = pfVar9[lVar21 * iVar4 + uVar20];
          if ((fVar1 == 0.0) && (!NAN(fVar1))) {
            __assert_fail("coefficient != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                          ,0x5ec,"void stbir__resample_horizontal_upsample(stbir__info *, float *)")
            ;
          }
          if (0 < (int)uVar3) {
            uVar18 = 0;
            do {
              pfVar14[uVar18] = *(float *)(lVar12 + uVar18 * 4) * fVar1 + pfVar14[uVar18];
              uVar18 = uVar18 + 1;
            } while (uVar3 != uVar18);
          }
          uVar20 = uVar20 + 1;
          lVar12 = lVar12 + lVar11 * 4;
        } while (uVar20 != (iVar6 - iVar5) + 1);
      }
      lVar21 = lVar21 + 1;
      pfVar15 = pfVar15 + iVar4;
      pfVar14 = pfVar14 + lVar11;
    } while (lVar21 != iVar2);
  }
  return;
}

Assistant:

static void stbir__resample_horizontal_upsample(stbir__info* stbir_info, float* output_buffer)
{
    int x, k;
    int output_w = stbir_info->output_w;
    int channels = stbir_info->channels;
    float* decode_buffer = stbir__get_decode_buffer(stbir_info);
    stbir__contributors* horizontal_contributors = stbir_info->horizontal_contributors;
    float* horizontal_coefficients = stbir_info->horizontal_coefficients;
    int coefficient_width = stbir_info->horizontal_coefficient_width;

    for (x = 0; x < output_w; x++)
    {
        int n0 = horizontal_contributors[x].n0;
        int n1 = horizontal_contributors[x].n1;

        int out_pixel_index = x * channels;
        int coefficient_group = coefficient_width * x;
        int coefficient_counter = 0;

        STBIR_ASSERT(n1 >= n0);
        STBIR_ASSERT(n0 >= -stbir_info->horizontal_filter_pixel_margin);
        STBIR_ASSERT(n1 >= -stbir_info->horizontal_filter_pixel_margin);
        STBIR_ASSERT(n0 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin);
        STBIR_ASSERT(n1 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin);

        switch (channels) {
            case 1:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 1;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                }
                break;
            case 2:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 2;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                }
                break;
            case 3:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 3;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                    output_buffer[out_pixel_index + 2] += decode_buffer[in_pixel_index + 2] * coefficient;
                }
                break;
            case 4:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 4;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                    output_buffer[out_pixel_index + 2] += decode_buffer[in_pixel_index + 2] * coefficient;
                    output_buffer[out_pixel_index + 3] += decode_buffer[in_pixel_index + 3] * coefficient;
                }
                break;
            default:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * channels;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    int c;
                    STBIR_ASSERT(coefficient != 0);
                    for (c = 0; c < channels; c++)
                        output_buffer[out_pixel_index + c] += decode_buffer[in_pixel_index + c] * coefficient;
                }
                break;
        }
    }
}